

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::execution_is_noop(Compiler *this,SPIRBlock *from,SPIRBlock *to)

{
  BlockID *pBVar1;
  bool bVar2;
  Phi *pPVar3;
  long lVar4;
  SPIRBlock *pSVar5;
  
  bVar2 = execution_is_branchless(this,from,to);
  if (bVar2) {
    while ((pSVar5 = from, bVar2 = (pSVar5->super_IVariant).self.id == (to->super_IVariant).self.id,
           !bVar2 && ((pSVar5->ops).super_VectorView<spirv_cross::Instruction>.buffer_size == 0))) {
      from = get<spirv_cross::SPIRBlock>(this,(pSVar5->next_block).id);
      pPVar3 = (from->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
      lVar4 = (from->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size * 0xc;
      while (lVar4 != 0) {
        pBVar1 = &pPVar3->parent;
        pPVar3 = pPVar3 + 1;
        lVar4 = lVar4 + -0xc;
        if (pBVar1->id == (pSVar5->super_IVariant).self.id) goto LAB_00356774;
      }
    }
  }
  else {
LAB_00356774:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Compiler::execution_is_noop(const SPIRBlock &from, const SPIRBlock &to) const
{
	if (!execution_is_branchless(from, to))
		return false;

	auto *start = &from;
	for (;;)
	{
		if (start->self == to.self)
			return true;

		if (!start->ops.empty())
			return false;

		auto &next = get<SPIRBlock>(start->next_block);
		// Flushing phi variables does not count as noop.
		for (auto &phi : next.phi_variables)
			if (phi.parent == start->self)
				return false;

		start = &next;
	}
}